

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

Value * __thiscall
vkt::shaderexecutor::DefaultSampling<tcu::Matrix<float,_2,_3>_>::genRandom
          (Value *__return_storage_ptr__,DefaultSampling<tcu::Matrix<float,_2,_3>_> *this,
          FloatFormat *fmt,Precision prec,Random *rnd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  long lVar4;
  long extraout_RDX;
  float *this_00;
  long lVar5;
  long lVar6;
  float fVar7;
  undefined1 auVar8 [16];
  bool bVar9;
  
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  auVar2 = _DAT_00ac4b80;
  auVar1 = _DAT_00ac4b30;
  lVar4 = 0;
  bVar9 = true;
  do {
    bVar3 = bVar9;
    this_00 = (__return_storage_ptr__->m_data).m_data[1].m_data + lVar4;
    lVar5 = 0;
    auVar8 = auVar1;
    do {
      bVar9 = SUB164(auVar8 ^ auVar2,4) == -0x80000000 && SUB164(auVar8 ^ auVar2,0) < -0x7ffffffd;
      if (bVar9) {
        fVar7 = 1.0;
        if (lVar4 != lVar5) {
          fVar7 = 0.0;
        }
        this_00[(lVar5 + -1) * 2] = fVar7;
      }
      if (bVar9) {
        fVar7 = 1.0;
        if (lVar4 + -1 != lVar5) {
          fVar7 = 0.0;
        }
        this_00[lVar5 * 2] = fVar7;
      }
      lVar5 = lVar5 + 2;
      lVar6 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar6 + 2;
    } while (lVar5 != 4);
    lVar4 = 1;
    bVar9 = false;
  } while (bVar3);
  lVar5 = 0;
  bVar9 = true;
  do {
    bVar3 = bVar9;
    lVar6 = 0;
    do {
      fVar7 = DefaultSampling<float>::genRandom
                        ((DefaultSampling<float> *)this_00,fmt,(Precision)lVar4,rnd);
      (__return_storage_ptr__->m_data).m_data[lVar6].m_data[lVar5] = fVar7;
      lVar6 = lVar6 + 1;
      lVar4 = extraout_RDX;
    } while (lVar6 != 3);
    lVar5 = 1;
    bVar9 = false;
  } while (bVar3);
  return __return_storage_ptr__;
}

Assistant:

Value	genRandom	(const FloatFormat& fmt, Precision prec, Random& rnd) const
	{
		Value ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = instance<DefaultSampling<T> >().genRandom(fmt, prec, rnd);

		return ret;
	}